

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O0

void ZSTD_rescaleFreqs(optState_t *optPtr,BYTE *src,size_t srcSize,int optLevel)

{
  int iVar1;
  U32 UVar2;
  uint local_1f8;
  uint local_1f4;
  uint local_1f0;
  uint local_1ec;
  uint local_1e8 [2];
  uint baseOFCfreqs [32];
  uint local_15c;
  uint local_158;
  uint ml_1;
  uint baseLLfreqs [36];
  uint lit_1;
  U32 bitCost_3;
  U32 scaleLog_3;
  FSE_CState_t ofstate;
  uint of;
  U32 bitCost_2;
  U32 scaleLog_2;
  FSE_CState_t mlstate;
  uint ml;
  U32 bitCost_1;
  U32 scaleLog_1;
  FSE_CState_t llstate;
  uint ll;
  U32 bitCost;
  U32 scaleLog;
  uint lit;
  int compressedLiterals;
  int optLevel_local;
  size_t srcSize_local;
  BYTE *src_local;
  optState_t *optPtr_local;
  
  iVar1 = ZSTD_compressedLiterals(optPtr);
  optPtr->priceType = zop_dynamic;
  if (optPtr->litLengthSum == 0) {
    if (srcSize < 9) {
      optPtr->priceType = zop_predef;
    }
    if (optPtr->symbolCosts == (ZSTD_entropyCTables_t *)0x0) {
      __assert_fail("optPtr->symbolCosts != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                    ,0x9a,
                    "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                   );
    }
    if ((optPtr->symbolCosts->huf).repeatMode == HUF_repeat_valid) {
      optPtr->priceType = zop_dynamic;
      if (iVar1 != 0) {
        if (optPtr->litFreq == (uint *)0x0) {
          __assert_fail("optPtr->litFreq != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                        ,0xa3,
                        "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                       );
        }
        optPtr->litSum = 0;
        for (bitCost = 0; bitCost < 0x100; bitCost = bitCost + 1) {
          llstate._28_4_ = HUF_getNbBitsFromCTable((HUF_CElt *)optPtr->symbolCosts,bitCost);
          if (0xb < (uint)llstate._28_4_) {
            __assert_fail("bitCost <= scaleLog",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                          ,0xa8,
                          "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                         );
          }
          if (llstate._28_4_ == 0) {
            local_1ec = 1;
          }
          else {
            local_1ec = 1 << (0xbU - (char)llstate._28_4_ & 0x1f);
          }
          optPtr->litFreq[bitCost] = local_1ec;
          optPtr->litSum = optPtr->litFreq[bitCost] + optPtr->litSum;
        }
      }
      FSE_initCState((FSE_CState_t *)&bitCost_1,(optPtr->symbolCosts->fse).litlengthCTable);
      optPtr->litLengthSum = 0;
      for (llstate.stateLog = 0; llstate.stateLog < 0x24; llstate.stateLog = llstate.stateLog + 1) {
        UVar2 = FSE_getMaxNbBits(llstate.stateTable,llstate.stateLog);
        if (9 < UVar2) {
          __assert_fail("bitCost < scaleLog",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                        ,0xb4,
                        "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                       );
        }
        if (UVar2 == 0) {
          local_1f0 = 1;
        }
        else {
          local_1f0 = 1 << (10U - (char)UVar2 & 0x1f);
        }
        optPtr->litLengthFreq[llstate.stateLog] = local_1f0;
        optPtr->litLengthSum = optPtr->litLengthFreq[llstate.stateLog] + optPtr->litLengthSum;
      }
      FSE_initCState((FSE_CState_t *)&bitCost_2,(optPtr->symbolCosts->fse).matchlengthCTable);
      optPtr->matchLengthSum = 0;
      for (mlstate._28_4_ = 0; (uint)mlstate._28_4_ < 0x35; mlstate._28_4_ = mlstate._28_4_ + 1) {
        UVar2 = FSE_getMaxNbBits(mlstate.stateTable,mlstate._28_4_);
        if (9 < UVar2) {
          __assert_fail("bitCost < scaleLog",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                        ,0xc0,
                        "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                       );
        }
        if (UVar2 == 0) {
          local_1f4 = 1;
        }
        else {
          local_1f4 = 1 << (10U - (char)UVar2 & 0x1f);
        }
        optPtr->matchLengthFreq[(uint)mlstate._28_4_] = local_1f4;
        optPtr->matchLengthSum =
             optPtr->matchLengthFreq[(uint)mlstate._28_4_] + optPtr->matchLengthSum;
      }
      FSE_initCState((FSE_CState_t *)&bitCost_3,(optPtr->symbolCosts->fse).offcodeCTable);
      optPtr->offCodeSum = 0;
      for (ofstate._28_4_ = 0; (uint)ofstate._28_4_ < 0x20; ofstate._28_4_ = ofstate._28_4_ + 1) {
        UVar2 = FSE_getMaxNbBits(ofstate.stateTable,ofstate._28_4_);
        if (9 < UVar2) {
          __assert_fail("bitCost < scaleLog",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                        ,0xcc,
                        "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                       );
        }
        if (UVar2 == 0) {
          local_1f8 = 1;
        }
        else {
          local_1f8 = 1 << (10U - (char)UVar2 & 0x1f);
        }
        optPtr->offCodeFreq[(uint)ofstate._28_4_] = local_1f8;
        optPtr->offCodeSum = optPtr->offCodeFreq[(uint)ofstate._28_4_] + optPtr->offCodeSum;
      }
    }
    else {
      if (optPtr->litFreq == (uint *)0x0) {
        __assert_fail("optPtr->litFreq != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                      ,0xd3,
                      "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                     );
      }
      if (iVar1 != 0) {
        baseLLfreqs[0x23] = 0xff;
        HIST_count_simple(optPtr->litFreq,baseLLfreqs + 0x23,src,srcSize);
        UVar2 = ZSTD_downscaleStats(optPtr->litFreq,0xff,8,base_0possible);
        optPtr->litSum = UVar2;
      }
      memcpy(&local_158,&DAT_004a6510,0x90);
      memcpy(optPtr->litLengthFreq,&local_158,0x90);
      UVar2 = sum_u32(&local_158,0x24);
      optPtr->litLengthSum = UVar2;
      for (local_15c = 0; local_15c < 0x35; local_15c = local_15c + 1) {
        optPtr->matchLengthFreq[local_15c] = 1;
      }
      optPtr->matchLengthSum = 0x35;
      memcpy(local_1e8,&DAT_004a65a0,0x80);
      memcpy(optPtr->offCodeFreq,local_1e8,0x80);
      UVar2 = sum_u32(local_1e8,0x20);
      optPtr->offCodeSum = UVar2;
    }
  }
  else {
    if (iVar1 != 0) {
      UVar2 = ZSTD_scaleStats(optPtr->litFreq,0xff,0xc);
      optPtr->litSum = UVar2;
    }
    UVar2 = ZSTD_scaleStats(optPtr->litLengthFreq,0x23,0xb);
    optPtr->litLengthSum = UVar2;
    UVar2 = ZSTD_scaleStats(optPtr->matchLengthFreq,0x34,0xb);
    optPtr->matchLengthSum = UVar2;
    UVar2 = ZSTD_scaleStats(optPtr->offCodeFreq,0x1f,0xb);
    optPtr->offCodeSum = UVar2;
  }
  ZSTD_setBasePrices(optPtr,optLevel);
  return;
}

Assistant:

static void
ZSTD_rescaleFreqs(optState_t* const optPtr,
            const BYTE* const src, size_t const srcSize,
                  int const optLevel)
{
    int const compressedLiterals = ZSTD_compressedLiterals(optPtr);
    DEBUGLOG(5, "ZSTD_rescaleFreqs (srcSize=%u)", (unsigned)srcSize);
    optPtr->priceType = zop_dynamic;

    if (optPtr->litLengthSum == 0) {  /* no literals stats collected -> first block assumed -> init */

        /* heuristic: use pre-defined stats for too small inputs */
        if (srcSize <= ZSTD_PREDEF_THRESHOLD) {
            DEBUGLOG(5, "srcSize <= %i : use predefined stats", ZSTD_PREDEF_THRESHOLD);
            optPtr->priceType = zop_predef;
        }

        assert(optPtr->symbolCosts != NULL);
        if (optPtr->symbolCosts->huf.repeatMode == HUF_repeat_valid) {

            /* huffman stats covering the full value set : table presumed generated by dictionary */
            optPtr->priceType = zop_dynamic;

            if (compressedLiterals) {
                /* generate literals statistics from huffman table */
                unsigned lit;
                assert(optPtr->litFreq != NULL);
                optPtr->litSum = 0;
                for (lit=0; lit<=MaxLit; lit++) {
                    U32 const scaleLog = 11;   /* scale to 2K */
                    U32 const bitCost = HUF_getNbBitsFromCTable(optPtr->symbolCosts->huf.CTable, lit);
                    assert(bitCost <= scaleLog);
                    optPtr->litFreq[lit] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->litSum += optPtr->litFreq[lit];
            }   }

            {   unsigned ll;
                FSE_CState_t llstate;
                FSE_initCState(&llstate, optPtr->symbolCosts->fse.litlengthCTable);
                optPtr->litLengthSum = 0;
                for (ll=0; ll<=MaxLL; ll++) {
                    U32 const scaleLog = 10;   /* scale to 1K */
                    U32 const bitCost = FSE_getMaxNbBits(llstate.symbolTT, ll);
                    assert(bitCost < scaleLog);
                    optPtr->litLengthFreq[ll] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->litLengthSum += optPtr->litLengthFreq[ll];
            }   }

            {   unsigned ml;
                FSE_CState_t mlstate;
                FSE_initCState(&mlstate, optPtr->symbolCosts->fse.matchlengthCTable);
                optPtr->matchLengthSum = 0;
                for (ml=0; ml<=MaxML; ml++) {
                    U32 const scaleLog = 10;
                    U32 const bitCost = FSE_getMaxNbBits(mlstate.symbolTT, ml);
                    assert(bitCost < scaleLog);
                    optPtr->matchLengthFreq[ml] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->matchLengthSum += optPtr->matchLengthFreq[ml];
            }   }

            {   unsigned of;
                FSE_CState_t ofstate;
                FSE_initCState(&ofstate, optPtr->symbolCosts->fse.offcodeCTable);
                optPtr->offCodeSum = 0;
                for (of=0; of<=MaxOff; of++) {
                    U32 const scaleLog = 10;
                    U32 const bitCost = FSE_getMaxNbBits(ofstate.symbolTT, of);
                    assert(bitCost < scaleLog);
                    optPtr->offCodeFreq[of] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->offCodeSum += optPtr->offCodeFreq[of];
            }   }

        } else {  /* first block, no dictionary */

            assert(optPtr->litFreq != NULL);
            if (compressedLiterals) {
                /* base initial cost of literals on direct frequency within src */
                unsigned lit = MaxLit;
                HIST_count_simple(optPtr->litFreq, &lit, src, srcSize);   /* use raw first block to init statistics */
                optPtr->litSum = ZSTD_downscaleStats(optPtr->litFreq, MaxLit, 8, base_0possible);
            }

            {   unsigned const baseLLfreqs[MaxLL+1] = {
                    4, 2, 1, 1, 1, 1, 1, 1,
                    1, 1, 1, 1, 1, 1, 1, 1,
                    1, 1, 1, 1, 1, 1, 1, 1,
                    1, 1, 1, 1, 1, 1, 1, 1,
                    1, 1, 1, 1
                };
                ZSTD_memcpy(optPtr->litLengthFreq, baseLLfreqs, sizeof(baseLLfreqs));
                optPtr->litLengthSum = sum_u32(baseLLfreqs, MaxLL+1);
            }

            {   unsigned ml;
                for (ml=0; ml<=MaxML; ml++)
                    optPtr->matchLengthFreq[ml] = 1;
            }
            optPtr->matchLengthSum = MaxML+1;

            {   unsigned const baseOFCfreqs[MaxOff+1] = {
                    6, 2, 1, 1, 2, 3, 4, 4,
                    4, 3, 2, 1, 1, 1, 1, 1,
                    1, 1, 1, 1, 1, 1, 1, 1,
                    1, 1, 1, 1, 1, 1, 1, 1
                };
                ZSTD_memcpy(optPtr->offCodeFreq, baseOFCfreqs, sizeof(baseOFCfreqs));
                optPtr->offCodeSum = sum_u32(baseOFCfreqs, MaxOff+1);
            }

        }

    } else {   /* new block : scale down accumulated statistics */

        if (compressedLiterals)
            optPtr->litSum = ZSTD_scaleStats(optPtr->litFreq, MaxLit, 12);
        optPtr->litLengthSum = ZSTD_scaleStats(optPtr->litLengthFreq, MaxLL, 11);
        optPtr->matchLengthSum = ZSTD_scaleStats(optPtr->matchLengthFreq, MaxML, 11);
        optPtr->offCodeSum = ZSTD_scaleStats(optPtr->offCodeFreq, MaxOff, 11);
    }

    ZSTD_setBasePrices(optPtr, optLevel);
}